

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_pages.cc
# Opt level: O0

void __thiscall
QPDF::getAllPagesInternal
          (QPDF *this,QPDFObjectHandle *cur_node,set *visited,set *seen,bool media_box)

{
  string *psVar1;
  set *psVar2;
  bool bVar3;
  int iVar4;
  QPDFExc *pQVar5;
  pointer pMVar6;
  element_type *peVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte local_6a1;
  QPDFObjectHandle local_5a8;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  allocator<char> local_519;
  string local_518;
  QPDFObjGen local_4f8;
  QPDFObjectHandle local_4f0;
  QPDFObjectHandle local_4e0;
  QPDFObjectHandle local_4d0;
  string local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  QPDFObjGen local_460;
  QPDFObjectHandle local_458;
  QPDFObjectHandle local_448;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  Rectangle local_3d8;
  QPDFObjectHandle local_3b8;
  allocator<char> local_3a1;
  string local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  byte local_31c;
  byte local_31b;
  byte local_31a;
  allocator<char> local_319;
  string local_318 [32];
  QPDFObjectHandle local_2f8;
  QPDFObjectHandle local_2e8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  string *local_288;
  QPDFObjectHandle *kid;
  iterator __end1;
  iterator __begin1;
  Array *__range1;
  int i;
  QPDFObjGen local_228;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  QPDFObjGen local_1dc;
  allocator<char> local_1d1;
  string local_1d0 [32];
  undefined1 local_1b0 [8];
  QPDFObjectHandle kids;
  string local_198 [32];
  QPDFObjectHandle local_178;
  QPDFObjectHandle local_168;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  undefined1 local_b2;
  allocator<char> local_b1;
  string local_b0;
  QPDFObjGen local_90;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  QPDFObjGen local_34;
  byte local_29;
  set *psStack_28;
  bool media_box_local;
  set *seen_local;
  set *visited_local;
  QPDFObjectHandle *cur_node_local;
  QPDF *this_local;
  
  local_29 = media_box;
  psStack_28 = seen;
  seen_local = visited;
  visited_local = (set *)cur_node;
  cur_node_local = (QPDFObjectHandle *)this;
  local_34 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&cur_node->super_BaseHandle);
  bVar3 = QPDFObjGen::set::add(visited,local_34);
  if (!bVar3) {
    local_b2 = 1;
    pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
    pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar7 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar6->file);
    iVar4 = (*peVar7->_vptr_InputSource[3])();
    local_90 = QPDFObjectHandle::getObjGen(cur_node);
    QPDFObjGen::unparse_abi_cxx11_(&local_88,&local_90,' ');
    std::operator+(&local_68,"object ",&local_88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"Loop detected in /Pages structure (getAllPages)",&local_b1);
    QPDFExc::QPDFExc(pQVar5,qpdf_e_pages,(string *)CONCAT44(extraout_var,iVar4),&local_68,0,
                     &local_b0);
    local_b2 = 0;
    __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"/Pages",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
  bVar3 = QPDFObjectHandle::isDictionaryOfType(cur_node,&local_d8,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"/Type key should be /Pages but is not; overriding",&local_129);
    QPDFObjectHandle::warnIfPossible(cur_node,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"/Type",&local_151);
    operator____qpdf((char *)&local_168,0x41a101);
    QPDFObjectHandle::replaceKey(cur_node,&local_150,&local_168);
    QPDFObjectHandle::~QPDFObjectHandle(&local_168);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
  }
  if ((local_29 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_198,"/MediaBox",
               (allocator<char> *)
               ((long)&kids.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QPDFObjectHandle::getKey(&local_178,(string *)cur_node);
    local_29 = QPDFObjectHandle::isRectangle(&local_178);
    QPDFObjectHandle::~QPDFObjectHandle(&local_178);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&kids.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               + 7));
    QTC::TC("qpdf","QPDF inherit mediabox",(uint)((local_29 & 1) == 0));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"/Kids",&local_1d1);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)local_1b0,(string *)cur_node);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  psVar2 = seen_local;
  local_1dc = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_1b0);
  bVar3 = QPDFObjGen::set::add(psVar2,local_1dc);
  if (!bVar3) {
    __range1._6_1_ = 1;
    pQVar5 = (QPDFExc *)__cxa_allocate_exception(0x80);
    pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                       (&this->m);
    peVar7 = std::__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<InputSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&pMVar6->file);
    iVar4 = (*peVar7->_vptr_InputSource[3])();
    local_228 = QPDFObjectHandle::getObjGen(cur_node);
    QPDFObjGen::unparse_abi_cxx11_(&local_220,&local_228,' ');
    std::operator+(&local_200,"object ",&local_220);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i,"Loop detected in /Pages structure (getAllPages)",
               (allocator<char> *)((long)&__range1 + 7));
    QPDFExc::QPDFExc(pQVar5,qpdf_e_pages,(string *)CONCAT44(extraout_var_00,iVar4),&local_200,0,
                     (string *)&i);
    __range1._6_1_ = 0;
    __cxa_throw(pQVar5,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
  }
  __range1._0_4_ = -1;
  QPDFObjectHandle::as_array((Array *)&__begin1,(QPDFObjectHandle *)local_1b0,any);
  __end1 = ::qpdf::Array::begin((Array *)&__begin1);
  kid = (QPDFObjectHandle *)::qpdf::Array::end((Array *)&__begin1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                     *)&kid), bVar3) {
    local_288 = (string *)
                __gnu_cxx::
                __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                ::operator*(&__end1);
    __range1._0_4_ = (int)__range1 + 1;
    bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_288);
    psVar1 = local_288;
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"/Kids",&local_2d1);
      bVar3 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)psVar1,&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator(&local_2d1);
      psVar1 = local_288;
      if (bVar3) {
        QPDFObjectHandle::QPDFObjectHandle(&local_2e8,(QPDFObjectHandle *)local_288);
        getAllPagesInternal(this,&local_2e8,seen_local,psStack_28,(bool)(local_29 & 1));
        QPDFObjectHandle::~QPDFObjectHandle(&local_2e8);
      }
      else {
        local_31a = 0;
        local_31b = 0;
        local_31c = 0;
        local_6a1 = 0;
        if ((local_29 & 1) == 0) {
          std::allocator<char>::allocator();
          local_31a = 1;
          std::__cxx11::string::string<std::allocator<char>>(local_318,"/MediaBox",&local_319);
          local_31b = 1;
          QPDFObjectHandle::getKey(&local_2f8,psVar1);
          local_31c = 1;
          bVar3 = QPDFObjectHandle::isRectangle(&local_2f8);
          local_6a1 = bVar3 ^ 0xff;
        }
        if ((local_31c & 1) != 0) {
          QPDFObjectHandle::~QPDFObjectHandle(&local_2f8);
        }
        if ((local_31b & 1) != 0) {
          std::__cxx11::string::~string(local_318);
        }
        if ((local_31a & 1) != 0) {
          std::allocator<char>::~allocator(&local_319);
        }
        if ((local_6a1 & 1) != 0) {
          QTC::TC("qpdf","QPDF missing mediabox",0);
          psVar1 = local_288;
          std::__cxx11::to_string(&local_380,(int)__range1);
          std::operator+(&local_360,"kid ",&local_380);
          std::operator+(&local_340,&local_360,
                         " (from 0) MediaBox is undefined; setting to letter / ANSI A");
          QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)psVar1,&local_340);
          std::__cxx11::string::~string((string *)&local_340);
          std::__cxx11::string::~string((string *)&local_360);
          std::__cxx11::string::~string((string *)&local_380);
          psVar1 = local_288;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_3a0,"/MediaBox",&local_3a1);
          QPDFObjectHandle::Rectangle::Rectangle(&local_3d8,0.0,0.0,612.0,792.0);
          QPDFObjectHandle::newArray(&local_3b8,&local_3d8);
          QPDFObjectHandle::replaceKey((QPDFObjectHandle *)psVar1,&local_3a0,&local_3b8);
          QPDFObjectHandle::~QPDFObjectHandle(&local_3b8);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::allocator<char>::~allocator(&local_3a1);
        }
        bVar3 = QPDFObjectHandle::isIndirect((QPDFObjectHandle *)local_288);
        psVar2 = psStack_28;
        if (bVar3) {
          local_460 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_288);
          bVar3 = QPDFObjGen::set::add(psVar2,local_460);
          if (!bVar3) {
            QTC::TC("qpdf","QPDF resolve duplicated page object",0);
            std::__cxx11::to_string(&local_4c0,(int)__range1);
            std::operator+(&local_4a0,"kid ",&local_4c0);
            std::operator+(&local_480,&local_4a0,
                           " (from 0) appears more than once in the pages tree; creating a new page object as a copy"
                          );
            QPDFObjectHandle::warnIfPossible(cur_node,&local_480);
            std::__cxx11::string::~string((string *)&local_480);
            std::__cxx11::string::~string((string *)&local_4a0);
            std::__cxx11::string::~string((string *)&local_4c0);
            QPDFObjectHandle::QPDFObjectHandle(&local_4f0,(QPDFObjectHandle *)local_288);
            QPDFObjectHandle::shallowCopy(&local_4e0);
            makeIndirectObject((QPDF *)&local_4d0,(QPDFObjectHandle *)this);
            QPDFObjectHandle::operator=((QPDFObjectHandle *)local_288,&local_4d0);
            QPDFObjectHandle::~QPDFObjectHandle(&local_4d0);
            QPDFObjectHandle::~QPDFObjectHandle(&local_4e0);
            QPDFObjectHandle::~QPDFObjectHandle(&local_4f0);
            psVar2 = psStack_28;
            local_4f8 = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_288);
            QPDFObjGen::set::add(psVar2,local_4f8);
          }
        }
        else {
          QTC::TC("qpdf","QPDF handle direct page object",0);
          std::__cxx11::to_string(&local_438,(int)__range1);
          std::operator+(&local_418,"kid ",&local_438);
          std::operator+(&local_3f8,&local_418," (from 0) is direct; converting to indirect");
          QPDFObjectHandle::warnIfPossible(cur_node,&local_3f8);
          std::__cxx11::string::~string((string *)&local_3f8);
          std::__cxx11::string::~string((string *)&local_418);
          std::__cxx11::string::~string((string *)&local_438);
          QPDFObjectHandle::QPDFObjectHandle(&local_458,(QPDFObjectHandle *)local_288);
          makeIndirectObject((QPDF *)&local_448,(QPDFObjectHandle *)this);
          QPDFObjectHandle::operator=((QPDFObjectHandle *)local_288,&local_448);
          QPDFObjectHandle::~QPDFObjectHandle(&local_448);
          QPDFObjectHandle::~QPDFObjectHandle(&local_458);
        }
        psVar1 = local_288;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"/Page",&local_519);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,"",&local_541);
        bVar3 = QPDFObjectHandle::isDictionaryOfType
                          ((QPDFObjectHandle *)psVar1,&local_518,&local_540);
        std::__cxx11::string::~string((string *)&local_540);
        std::allocator<char>::~allocator(&local_541);
        std::__cxx11::string::~string((string *)&local_518);
        std::allocator<char>::~allocator(&local_519);
        psVar1 = local_288;
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_568,"/Type key should be /Page but is not; overriding",
                     &local_569);
          QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)psVar1,&local_568);
          std::__cxx11::string::~string((string *)&local_568);
          std::allocator<char>::~allocator(&local_569);
          psVar1 = local_288;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_590,"/Type",&local_591);
          operator____qpdf((char *)&local_5a8,0x42dc4e);
          QPDFObjectHandle::replaceKey((QPDFObjectHandle *)psVar1,&local_590,&local_5a8);
          QPDFObjectHandle::~QPDFObjectHandle(&local_5a8);
          std::__cxx11::string::~string((string *)&local_590);
          std::allocator<char>::~allocator(&local_591);
        }
        pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                           (&this->m);
        std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                  (&pMVar6->all_pages,(value_type *)local_288);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,"Pages tree includes non-dictionary object; ignoring",
                 &local_2a9);
      QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)psVar1,&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
      pMVar6 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->
                         (&this->m);
      pMVar6->invalid_page_found = true;
    }
    __gnu_cxx::
    __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  ::qpdf::Array::~Array((Array *)&__begin1);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_1b0);
  return;
}

Assistant:

void
QPDF::getAllPagesInternal(
    QPDFObjectHandle cur_node, QPDFObjGen::set& visited, QPDFObjGen::set& seen, bool media_box)
{
    if (!visited.add(cur_node)) {
        throw QPDFExc(
            qpdf_e_pages,
            m->file->getName(),
            "object " + cur_node.getObjGen().unparse(' '),
            0,
            "Loop detected in /Pages structure (getAllPages)");
    }
    if (!cur_node.isDictionaryOfType("/Pages")) {
        cur_node.warnIfPossible("/Type key should be /Pages but is not; overriding");
        cur_node.replaceKey("/Type", "/Pages"_qpdf);
    }
    if (!media_box) {
        media_box = cur_node.getKey("/MediaBox").isRectangle();
        QTC::TC("qpdf", "QPDF inherit mediabox", media_box ? 0 : 1);
    }
    auto kids = cur_node.getKey("/Kids");
    if (!visited.add(kids)) {
        throw QPDFExc(
            qpdf_e_pages,
            m->file->getName(),
            "object " + cur_node.getObjGen().unparse(' '),
            0,
            "Loop detected in /Pages structure (getAllPages)");
    }
    int i = -1;
    for (auto& kid: kids.as_array()) {
        ++i;
        if (!kid.isDictionary()) {
            kid.warnIfPossible("Pages tree includes non-dictionary object; ignoring");
            m->invalid_page_found = true;
            continue;
        }
        if (kid.hasKey("/Kids")) {
            getAllPagesInternal(kid, visited, seen, media_box);
        } else {
            if (!media_box && !kid.getKey("/MediaBox").isRectangle()) {
                QTC::TC("qpdf", "QPDF missing mediabox");
                kid.warnIfPossible(
                    "kid " + std::to_string(i) +
                    " (from 0) MediaBox is undefined; setting to letter / ANSI A");
                kid.replaceKey(
                    "/MediaBox",
                    QPDFObjectHandle::newArray(QPDFObjectHandle::Rectangle(0, 0, 612, 792)));
            }
            if (!kid.isIndirect()) {
                QTC::TC("qpdf", "QPDF handle direct page object");
                cur_node.warnIfPossible(
                    "kid " + std::to_string(i) + " (from 0) is direct; converting to indirect");
                kid = makeIndirectObject(kid);
            } else if (!seen.add(kid)) {
                // Make a copy of the page. This does the same as shallowCopyPage in
                // QPDFPageObjectHelper.
                QTC::TC("qpdf", "QPDF resolve duplicated page object");
                cur_node.warnIfPossible(
                    "kid " + std::to_string(i) +
                    " (from 0) appears more than once in the pages tree;"
                    " creating a new page object as a copy");
                kid = makeIndirectObject(QPDFObjectHandle(kid).shallowCopy());
                seen.add(kid);
            }
            if (!kid.isDictionaryOfType("/Page")) {
                kid.warnIfPossible("/Type key should be /Page but is not; overriding");
                kid.replaceKey("/Type", "/Page"_qpdf);
            }
            m->all_pages.push_back(kid);
        }
    }
}